

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::concat_sub_tree<char,false,5>
          (rrb_details *this,ref<immutable::rrb_details::tree_node<char,_false>_> *left_node,
          uint32_t left_shift,ref<immutable::rrb_details::tree_node<char,_false>_> *right_node,
          uint32_t right_shift,bool is_top)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar2;
  internal_node<char,_false> *piVar3;
  leaf_node<char,_false> *plVar4;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_d8;
  ref<immutable::rrb_details::internal_node<char,_false>_> centre_node_2;
  ref<immutable::rrb_details::tree_node<char,_false>_> right_node_temp_1;
  ref<immutable::rrb_details::tree_node<char,_false>_> left_node_temp_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> right_internal_2;
  ref<immutable::rrb_details::internal_node<char,_false>_> left_internal_2;
  ref<immutable::rrb_details::internal_node<char,_false>_> right_internal_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> left_internal_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_98;
  ref<immutable::rrb_details::internal_node<char,_false>_> merged;
  ref<immutable::rrb_details::leaf_node<char,_false>_> right_leaf;
  ref<immutable::rrb_details::leaf_node<char,_false>_> left_leaf;
  ref<immutable::rrb_details::internal_node<char,_false>_> empty_1;
  ref<immutable::rrb_details::internal_node<char,_false>_> centre_node_1;
  ref<immutable::rrb_details::tree_node<char,_false>_> right_node_temp;
  ref<immutable::rrb_details::internal_node<char,_false>_> right_internal;
  ref<immutable::rrb_details::internal_node<char,_false>_> empty;
  ref<immutable::rrb_details::internal_node<char,_false>_> centre_node;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_40;
  ref<immutable::rrb_details::tree_node<char,_false>_> left_node_temp;
  ref<immutable::rrb_details::internal_node<char,_false>_> left_internal;
  bool is_top_local;
  uint32_t right_shift_local;
  ref<immutable::rrb_details::tree_node<char,_false>_> *right_node_local;
  uint32_t left_shift_local;
  ref<immutable::rrb_details::tree_node<char,_false>_> *left_node_local;
  
  if (right_shift < left_shift) {
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&left_node_temp,left_node);
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_node_temp)
    ;
    prVar2 = piVar3->child;
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_node_temp)
    ;
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_40,
               prVar2 + (piVar3->len - 1));
    concat_sub_tree<char,false,5>
              ((rrb_details *)&empty,&local_40,left_shift - 5,right_node,right_shift,false);
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref
              (&right_internal,(internal_node<char,_false> *)0x0);
    rebalance<char,false,5>
              (this,(ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_node_temp,
               &empty,&right_internal,left_shift,is_top);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&right_internal);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&empty);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_40);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_node_temp);
    return (ref<immutable::rrb_details::internal_node<char,_false>_>)
           (internal_node<char,_false> *)this;
  }
  if (left_shift < right_shift) {
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&right_node_temp,right_node
              );
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&right_node_temp
                       );
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&centre_node_1,piVar3->child);
    concat_sub_tree<char,false,5>
              ((rrb_details *)&empty_1,left_node,left_shift,
               (ref<immutable::rrb_details::tree_node<char,_false>_> *)&centre_node_1,
               right_shift - 5,false);
    ref<immutable::rrb_details::internal_node<char,_false>_>::ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_leaf,
               (internal_node<char,_false> *)0x0);
    rebalance<char,false,5>
              (this,(ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_leaf,&empty_1,
               (ref<immutable::rrb_details::internal_node<char,_false>_> *)&right_node_temp,
               right_shift,is_top);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_leaf);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&empty_1);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&centre_node_1);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&right_node_temp);
    return (ref<immutable::rrb_details::internal_node<char,_false>_>)
           (internal_node<char,_false> *)this;
  }
  if (left_shift != 0) {
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&right_internal_2,left_node
              );
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&left_node_temp_1,
               right_node);
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&right_internal_2)
    ;
    prVar2 = piVar3->child;
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&right_internal_2)
    ;
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&right_node_temp_1,
               prVar2 + (piVar3->len - 1));
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                        &left_node_temp_1);
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&centre_node_2,piVar3->child);
    concat_sub_tree<char,false,5>
              ((rrb_details *)&local_d8,&right_node_temp_1,left_shift - 5,
               (ref<immutable::rrb_details::tree_node<char,_false>_> *)&centre_node_2,
               right_shift - 5,false);
    rebalance<char,false,5>
              (this,&right_internal_2,&local_d8,
               (ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_node_temp_1,
               left_shift,is_top);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_d8);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&centre_node_2);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&right_node_temp_1);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&left_node_temp_1);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&right_internal_2);
    return (ref<immutable::rrb_details::internal_node<char,_false>_>)
           (internal_node<char,_false> *)this;
  }
  ref<immutable::rrb_details::leaf_node<char,false>>::
  ref<immutable::rrb_details::tree_node<char,false>>
            ((ref<immutable::rrb_details::leaf_node<char,false>> *)&right_leaf,left_node);
  ref<immutable::rrb_details::leaf_node<char,false>>::
  ref<immutable::rrb_details::tree_node<char,false>>
            ((ref<immutable::rrb_details::leaf_node<char,false>> *)&merged,right_node);
  if (is_top) {
    plVar4 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&right_leaf);
    uVar1 = plVar4->len;
    plVar4 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&merged);
    if (uVar1 + plVar4->len < 0x21) {
      plVar4 = leaf_node_merge<char,false>(right_leaf.ptr,(leaf_node<char,_false> *)merged.ptr);
      ref<immutable::rrb_details::internal_node<char,false>>::
      ref<immutable::rrb_details::leaf_node<char,false>>
                ((ref<immutable::rrb_details::internal_node<char,false>> *)&local_98,plVar4);
      piVar3 = internal_node_new_above1<char,false>(&local_98);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,piVar3);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_98);
      goto LAB_00178178;
    }
  }
  ref<immutable::rrb_details::internal_node<char,false>>::
  ref<immutable::rrb_details::tree_node<char,false>>
            ((ref<immutable::rrb_details::internal_node<char,false>> *)&right_internal_1,left_node);
  ref<immutable::rrb_details::internal_node<char,false>>::
  ref<immutable::rrb_details::tree_node<char,false>>
            ((ref<immutable::rrb_details::internal_node<char,false>> *)&left_internal_2,right_node);
  piVar3 = internal_node_new_above<char,false>(&right_internal_1,&left_internal_2);
  ref<immutable::rrb_details::internal_node<char,_false>_>::ref
            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,piVar3);
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&left_internal_2);
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&right_internal_1);
LAB_00178178:
  ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref
            ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&merged);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&right_leaf);
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)
         (internal_node<char,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> concat_sub_tree(const ref<tree_node<T, atomic_ref_counting>>& left_node, uint32_t left_shift, const ref<tree_node<T, atomic_ref_counting>>& right_node, uint32_t right_shift, bool is_top)
      {
      if (left_shift > right_shift)
        {
        // Left tree is higher than right tree
        ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
        ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node, right_shift, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, empty, left_shift, is_top);
        }
      else if (left_shift < right_shift)
        {
        ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
        ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
        ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node, left_shift, right_node_temp, right_shift - bits<N>::rrb_bits, false);
        ref<internal_node<T, atomic_ref_counting>> empty(nullptr);
        return rebalance<T, atomic_ref_counting, N>(empty, centre_node, right_internal, right_shift, is_top);
        }
      else
        { // we have same height
        if (left_shift == 0)
          { // We're dealing with leaf nodes
          ref<leaf_node<T, atomic_ref_counting>> left_leaf = left_node;
          ref<leaf_node<T, atomic_ref_counting>> right_leaf = right_node;
          // We don't do this if we're not at top, as we'd have to zip stuff above
          // as well.
          if (is_top && (left_leaf->len + right_leaf->len) <= bits<N>::rrb_branching)
            {
            // Can put them in a single node
            ref<internal_node<T, atomic_ref_counting>> merged = leaf_node_merge<T, atomic_ref_counting>(left_leaf.ptr, right_leaf.ptr);
            return internal_node_new_above1(merged);
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
            ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
            return internal_node_new_above(left_internal, right_internal);
            }
          }
        else
          { // two internal nodes with same height. Move both down
          ref<internal_node<T, atomic_ref_counting>> left_internal = left_node;
          ref<internal_node<T, atomic_ref_counting>> right_internal = right_node;
          ref<tree_node<T, atomic_ref_counting>> left_node_temp = left_internal->child[left_internal->len - 1];
          ref<tree_node<T, atomic_ref_counting>> right_node_temp = right_internal->child[0];
          ref<internal_node<T, atomic_ref_counting>> centre_node = concat_sub_tree<T, atomic_ref_counting, N>(left_node_temp, left_shift - bits<N>::rrb_bits, right_node_temp, right_shift - bits<N>::rrb_bits, false);
          // can be optimised: since left_shift == right_shift, we'll end up in this
          // block again.
          return rebalance<T, atomic_ref_counting, N>(left_internal, centre_node, right_internal, left_shift, is_top);
          }
        }
      }